

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

bool __thiscall Analyser::analyse_variable_declaration(Analyser *this)

{
  any *__other;
  int iVar1;
  bool bVar2;
  bool bVar3;
  char cVar4;
  string *psVar5;
  any local_1b0;
  _Optional_payload_base<Token> local_1a0;
  optional<Token> next;
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  nextToken(&next,this);
  bVar2 = (bool)(next.super__Optional_base<Token,_false,_false>._M_payload.
                 super__Optional_payload<Token,_true,_false,_false>.
                 super__Optional_payload_base<Token>._M_payload._M_value._type == RESERVED_WORD &
                next.super__Optional_base<Token,_false,_false>._M_payload.
                super__Optional_payload<Token,_true,_false,_false>.
                super__Optional_payload_base<Token>._M_engaged);
  if (bVar2 == false) {
    unreadToken(this);
  }
  else {
    __other = &next.super__Optional_base<Token,_false,_false>._M_payload.
               super__Optional_payload<Token,_true,_false,_false>.
               super__Optional_payload_base<Token>._M_payload._M_value._value;
    std::any::any(&local_1b0,__other);
    std::any_cast<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a0,
               &local_1b0);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_1a0,"const");
    std::__cxx11::string::~string((string *)&local_1a0);
    std::any::reset(&local_1b0);
    if (bVar3) {
      cVar4 = analyse_type_specifier(this);
      if (cVar4 == 'v') {
        psVar5 = (string *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_50,"can not identify a \'void\' variable",(allocator<char> *)&local_1a0);
        iVar1 = this->_currentLine;
        std::__cxx11::string::string(psVar5,local_50);
        *(long *)(psVar5 + 0x20) = (long)iVar1;
        __cxa_throw(psVar5,&Error::typeinfo,Error::~Error);
      }
      do {
        nextToken((optional<Token> *)&local_1a0,this);
        std::_Optional_payload_base<Token>::_M_move_assign
                  ((_Optional_payload_base<Token> *)&next,&local_1a0);
        std::_Optional_payload_base<Token>::_M_reset(&local_1a0);
        if ((next.super__Optional_base<Token,_false,_false>._M_payload.
             super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
             _M_engaged != true) ||
           (next.super__Optional_base<Token,_false,_false>._M_payload.
            super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
            _M_payload._M_value._type != IDENTIFIER)) {
          psVar5 = (string *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_70,"Missing < init - declarator - list>",(allocator<char> *)&local_1a0);
          iVar1 = this->_currentLine;
          std::__cxx11::string::string(psVar5,local_70);
          *(long *)(psVar5 + 0x20) = (long)iVar1;
          __cxa_throw(psVar5,&Error::typeinfo,Error::~Error);
        }
        std::any::any(&local_1b0,__other);
        std::any_cast<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a0,
                   &local_1b0);
        addVariable(this,(string *)&local_1a0,true);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::any::reset(&local_1b0);
        bVar3 = analyse_initializer(this,'\0');
        if (!bVar3) {
          psVar5 = (string *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_90,"Missing <initializer>",(allocator<char> *)&local_1a0);
          iVar1 = this->_currentLine;
          std::__cxx11::string::string(psVar5,local_90);
          *(long *)(psVar5 + 0x20) = (long)iVar1;
          __cxa_throw(psVar5,&Error::typeinfo,Error::~Error);
        }
        nextToken((optional<Token> *)&local_1a0,this);
        std::_Optional_payload_base<Token>::_M_move_assign
                  ((_Optional_payload_base<Token> *)&next,&local_1a0);
        std::_Optional_payload_base<Token>::_M_reset(&local_1a0);
        if (next.super__Optional_base<Token,_false,_false>._M_payload.
            super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
            _M_engaged == false) {
          psVar5 = (string *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_b0,"Missing \';\'",(allocator<char> *)&local_1a0);
          iVar1 = this->_currentLine;
          std::__cxx11::string::string(psVar5,local_b0);
          *(long *)(psVar5 + 0x20) = (long)iVar1;
          __cxa_throw(psVar5,&Error::typeinfo,Error::~Error);
        }
      } while (next.super__Optional_base<Token,_false,_false>._M_payload.
               super__Optional_payload<Token,_true,_false,_false>.
               super__Optional_payload_base<Token>._M_payload._M_value._type == COMMA_SIGH);
      if (next.super__Optional_base<Token,_false,_false>._M_payload.
          super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
          _M_payload._M_value._type != SEMICOLON) {
        psVar5 = (string *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_d0,"Missing \';\'",(allocator<char> *)&local_1a0);
        iVar1 = this->_currentLine;
        std::__cxx11::string::string(psVar5,local_d0);
        *(long *)(psVar5 + 0x20) = (long)iVar1;
        __cxa_throw(psVar5,&Error::typeinfo,Error::~Error);
      }
    }
    else {
      unreadToken(this);
      cVar4 = analyse_type_specifier(this);
      if (cVar4 == 'v') {
        psVar5 = (string *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_f0,"can not identify a \'void\' variable",(allocator<char> *)&local_1a0);
        iVar1 = this->_currentLine;
        std::__cxx11::string::string(psVar5,local_f0);
        *(long *)(psVar5 + 0x20) = (long)iVar1;
        __cxa_throw(psVar5,&Error::typeinfo,Error::~Error);
      }
      do {
        nextToken((optional<Token> *)&local_1a0,this);
        std::_Optional_payload_base<Token>::_M_move_assign
                  ((_Optional_payload_base<Token> *)&next,&local_1a0);
        std::_Optional_payload_base<Token>::_M_reset(&local_1a0);
        if ((next.super__Optional_base<Token,_false,_false>._M_payload.
             super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
             _M_engaged != true) ||
           (next.super__Optional_base<Token,_false,_false>._M_payload.
            super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
            _M_payload._M_value._type != IDENTIFIER)) {
          psVar5 = (string *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_110,"Missing < init - declarator - list>",(allocator<char> *)&local_1a0);
          iVar1 = this->_currentLine;
          std::__cxx11::string::string(psVar5,local_110);
          *(long *)(psVar5 + 0x20) = (long)iVar1;
          __cxa_throw(psVar5,&Error::typeinfo,Error::~Error);
        }
        std::any::any(&local_1b0,__other);
        std::any_cast<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a0,
                   &local_1b0);
        addVariable(this,(string *)&local_1a0,false);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::any::reset(&local_1b0);
        bVar3 = analyse_initializer(this,'\0');
        if (!bVar3) {
          initializeVariable(this,cVar4);
        }
        nextToken((optional<Token> *)&local_1a0,this);
        std::_Optional_payload_base<Token>::_M_move_assign
                  ((_Optional_payload_base<Token> *)&next,&local_1a0);
        std::_Optional_payload_base<Token>::_M_reset(&local_1a0);
        if (next.super__Optional_base<Token,_false,_false>._M_payload.
            super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
            _M_engaged == false) {
          psVar5 = (string *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_130,"Missing \';\'",(allocator<char> *)&local_1a0);
          iVar1 = this->_currentLine;
          std::__cxx11::string::string(psVar5,local_130);
          *(long *)(psVar5 + 0x20) = (long)iVar1;
          __cxa_throw(psVar5,&Error::typeinfo,Error::~Error);
        }
      } while (next.super__Optional_base<Token,_false,_false>._M_payload.
               super__Optional_payload<Token,_true,_false,_false>.
               super__Optional_payload_base<Token>._M_payload._M_value._type == COMMA_SIGH);
      if (next.super__Optional_base<Token,_false,_false>._M_payload.
          super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
          _M_payload._M_value._type != SEMICOLON) {
        psVar5 = (string *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_150,"Missing \';\'",(allocator<char> *)&local_1a0);
        iVar1 = this->_currentLine;
        std::__cxx11::string::string(psVar5,local_150);
        *(long *)(psVar5 + 0x20) = (long)iVar1;
        __cxa_throw(psVar5,&Error::typeinfo,Error::~Error);
      }
    }
  }
  std::_Optional_payload_base<Token>::_M_reset((_Optional_payload_base<Token> *)&next);
  return bVar2;
}

Assistant:

bool Analyser::analyse_variable_declaration() {
	auto next = nextToken();
	if (!next.has_value() || (next.value().GetType() != TokenType::RESERVED_WORD)) {
		unreadToken();
		return false;
	}
	//const
	if (std::any_cast<std::string>(next.value().GetValue()) == "const") {
		char type = analyse_type_specifier();
		if (type == 'v') {
			throw Error("can not identify a 'void' variable", _currentLine);
		}
		do {
			//init - declarator - list
			next = nextToken();
			if (!next.has_value() || (next.value().GetType() != TokenType::IDENTIFIER)) {
				throw Error("Missing < init - declarator - list>", _currentLine);
			}
			addVariable(std::any_cast<std::string>(next.value().GetValue()), true);
			bool has_initializer = analyse_initializer(type);
			if (!has_initializer) {
				throw Error("Missing <initializer>", _currentLine);
			}
			next = nextToken();
			if (!next.has_value()) {
				throw Error("Missing ';'", _currentLine);
			}
		} while (next.value().GetType() == TokenType::COMMA_SIGH);
		if (next.value().GetType() != TokenType::SEMICOLON) {
			throw Error("Missing ';'", _currentLine);
		}
		return true;
	}
	//non-const
	else {
		unreadToken();
		char type = analyse_type_specifier();
		if (type == 'v') {
			throw Error("can not identify a 'void' variable", _currentLine);
		}
		do {
			////init - declarator - list
			next = nextToken();
			if (!next.has_value() || (next.value().GetType() != TokenType::IDENTIFIER)) {
				throw Error("Missing < init - declarator - list>", _currentLine);
			}
			addVariable(std::any_cast<std::string>(next.value().GetValue()), false);
			bool has_initializer = analyse_initializer(type);
			if (!has_initializer) {
				initializeVariable(type);
			}
			next = nextToken();
			if (!next.has_value()) {
				throw Error("Missing ';'", _currentLine);
			}
		} while (next.value().GetType() == TokenType::COMMA_SIGH);
		if (next.value().GetType() != TokenType::SEMICOLON) {
			throw Error("Missing ';'", _currentLine);
		}
		return true;
	}
}